

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

bool __thiscall flatbuffers::cpp::CppGenerator::TypeHasKey(CppGenerator *this,Type *type)

{
  FieldDef *pFVar1;
  bool bVar2;
  FieldDef **field;
  pointer ppFVar3;
  bool bVar4;
  
  if (type->base_type != BASE_TYPE_STRUCT) {
    return false;
  }
  ppFVar3 = (type->struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    bVar4 = ppFVar3 ==
            (type->struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    bVar2 = !bVar4;
    if (bVar4) {
      return bVar2;
    }
    pFVar1 = *ppFVar3;
    ppFVar3 = ppFVar3 + 1;
  } while (pFVar1->key != true);
  return bVar2;
}

Assistant:

bool TypeHasKey(const Type &type) {
    if (type.base_type != BASE_TYPE_STRUCT) { return false; }
    for (auto &field : type.struct_def->fields.vec) {
      if (field->key) { return true; }
    }
    return false;
  }